

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O3

void FM_KEYOFF(FM_OPN2 *OPN,FM_CH *CH,int s)

{
  FM_SLOT *pFVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  UINT8 UVar5;
  uint uVar6;
  UINT8 UVar7;
  uint uVar8;
  
  pFVar1 = CH->SLOT + (uint)s;
  if ((CH->SLOT[(uint)s].key != '\0') && (((OPN->SL3).key_csm == '\0' || (OPN->P_CH + 3 == CH)))) {
    if (1 < pFVar1->state) {
      pFVar1->state = '\x01';
      if ((pFVar1->ssg & 8) != 0) {
        iVar3 = pFVar1->volume;
        if ((pFVar1->ssg & 4) != pFVar1->ssgn) {
          iVar3 = 0x200 - iVar3;
          pFVar1->volume = iVar3;
        }
        if (0x1ff < iVar3) {
          pFVar1->volume = 0x3ff;
          pFVar1->state = '\0';
          iVar3 = 0x3ff;
        }
        pFVar1->vol_out = iVar3 + pFVar1->tl;
      }
    }
    if (OPN->LegacyMode != '\0') {
      bVar2 = CH->kcode >> (pFVar1->KSR & 0x1f);
      uVar4 = (uint)bVar2;
      iVar3 = pFVar1->DT[CH->kcode] + CH->fc;
      if (iVar3 < 0) {
        iVar3 = iVar3 + OPN->fn_max;
      }
      pFVar1->Incr = iVar3 * pFVar1->mul >> 1;
      if (uVar4 != pFVar1->ksr) {
        pFVar1->ksr = bVar2;
        uVar6 = pFVar1->ar + uVar4;
        if (uVar6 < 0x5e) {
          UVar5 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                  [uVar6];
          UVar7 = eg_rate_select[uVar6];
        }
        else {
          UVar7 = 0x90;
          UVar5 = '\0';
        }
        pFVar1->eg_sh_ar = UVar5;
        pFVar1->eg_sel_ar = UVar7;
        uVar6 = pFVar1->d1r + uVar4;
        pFVar1->eg_sh_d1r =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar6];
        uVar8 = pFVar1->d2r + uVar4;
        pFVar1->eg_sh_d2r =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar8];
        uVar4 = uVar4 + pFVar1->rr;
        pFVar1->eg_sh_rr =
             "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
             [uVar4];
        pFVar1->eg_sel_d1r = eg_rate_select[uVar6];
        pFVar1->eg_sel_d2r = eg_rate_select[uVar8];
        pFVar1->eg_sel_rr = eg_rate_select[uVar4];
      }
    }
  }
  pFVar1->key = '\0';
  return;
}

Assistant:

INLINE void FM_KEYOFF(FM_OPN2 *OPN, FM_CH *CH , int s )
{
	FM_SLOT *SLOT = &CH->SLOT[s];

	if (SLOT->key && (!OPN->SL3.key_csm || CH == &OPN->P_CH[3]))
	{
		if (SLOT->state>EG_REL)
		{
			SLOT->state = EG_REL; /* phase -> Release */

			/* SSG-EG specific update */
			if (SLOT->ssg&0x08)
			{
				/* convert EG attenuation level */
				if (SLOT->ssgn ^ (SLOT->ssg&0x04))
					SLOT->volume = (0x200 - SLOT->volume);

				/* force EG attenuation level */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state  = EG_OFF;
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
		}
		if (OPN->LegacyMode)	// workaround for VGMs trimmed with VGMTool
			refresh_fc_eg_slot(OPN, SLOT, CH->fc, CH->kcode);
	}

	SLOT->key = 0;
}